

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O3

void __thiscall CItems::RenderLaser(CItems *this,CNetObj_Laser *pCurrent)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CGameClient *pCVar3;
  CNetObj_GameData *pCVar4;
  IGraphics *pIVar5;
  int iVar6;
  int iVar7;
  IClient *pIVar8;
  int iVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = pCurrent->m_X;
  iVar7 = pCurrent->m_Y;
  uVar1 = pCurrent->m_FromX;
  uVar2 = pCurrent->m_FromY;
  if (RenderLaser(CNetObj_Laser_const*)::s_LastGameTick == '\0') {
    RenderLaser(this);
  }
  if (RenderLaser(CNetObj_Laser_const*)::s_LastIntraTick == '\0') {
    RenderLaser(this);
  }
  pCVar3 = (this->super_CComponent).m_pClient;
  pCVar4 = (pCVar3->m_Snap).m_pGameData;
  if ((pCVar4 == (CNetObj_GameData *)0x0) || ((pCVar4->m_GameStateFlags & 0x1c) == 0)) {
    pIVar8 = pCVar3->m_pClient;
    iVar9 = pIVar8->m_CurGameTick;
    RenderLaser::s_LastIntraTick = pIVar8->m_GameIntraTick;
    RenderLaser::s_LastGameTick = iVar9;
  }
  else {
    pIVar8 = pCVar3->m_pClient;
    iVar9 = pIVar8->m_CurGameTick;
  }
  fVar12 = (float)iVar6;
  fVar15 = (float)iVar7;
  fVar16 = (float)(int)uVar1;
  fVar17 = (float)(int)uVar2;
  fVar18 = fVar12 - fVar16;
  fVar20 = fVar15 - fVar17;
  fVar10 = SQRT(fVar18 * fVar18 + fVar20 * fVar20);
  fVar19 = ((((float)(iVar9 - pCurrent->m_StartTick) + RenderLaser::s_LastIntraTick) * 1000.0) /
           (float)pIVar8->m_GameTickSpeed) /
           ((float)(pCVar3->m_Tuning).m_LaserBounceDelay.m_Value / 100.0);
  fVar11 = 1.0;
  if (fVar19 <= 1.0) {
    fVar11 = fVar19;
  }
  fVar11 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                  ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar11));
  (*(pCVar3->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar19 = fVar11 * 7.0;
  auVar13._0_8_ = CONCAT44(fVar18,fVar20) ^ 0x8000000000000000;
  auVar13._8_4_ = fVar20;
  auVar13._12_4_ = fVar20;
  auVar14._4_4_ = fVar10;
  auVar14._0_4_ = fVar10;
  auVar14._8_4_ = fVar10;
  auVar14._12_4_ = fVar10;
  auVar14 = divps(auVar13,auVar14);
  fVar10 = fVar19 * auVar14._0_4_;
  fVar19 = fVar19 * auVar14._4_4_;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_38 = CONCAT44(fVar17 - fVar19,fVar16 - fVar10);
  uStack_30 = CONCAT44(fVar19 + fVar17,fVar10 + fVar16);
  local_28 = fVar12 - fVar10;
  fStack_24 = fVar15 - fVar19;
  fStack_20 = fVar10 + fVar12;
  fStack_1c = fVar19 + fVar15;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1e])(pIVar5,&local_38,1);
  fVar11 = fVar11 * 5.0;
  fVar10 = fVar11 * auVar14._0_4_;
  fVar11 = fVar11 * auVar14._4_4_;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_38 = CONCAT44(fVar17 - fVar11,fVar16 - fVar10);
  uStack_30 = CONCAT44(fVar11 + fVar17,fVar10 + fVar16);
  local_28 = fVar12 - fVar10;
  fStack_24 = fVar15 - fVar11;
  fStack_20 = fVar10 + fVar12;
  fStack_1c = fVar11 + fVar15;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1e])(pIVar5,&local_38,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
            (pIVar5,(ulong)(uint)g_pData->m_aImages[3].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  CRenderTools::SelectSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,
             *(int *)(&DAT_001d9f80 + (long)(RenderLaser::s_LastGameTick % 3) * 4),0,0,0);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
            ((float)RenderLaser::s_LastGameTick);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  uStack_40 = 0x41c00000;
  uStack_3c = 0x41c00000;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_48 = fVar12;
  fStack_44 = fVar15;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_48,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  uStack_40 = 0x41a00000;
  uStack_3c = 0x41a00000;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_48 = fVar12;
  fStack_44 = fVar15;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_48,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CItems::RenderLaser(const struct CNetObj_Laser *pCurrent)
{
	const vec2 Pos = vec2(pCurrent->m_X, pCurrent->m_Y);
	const vec2 From = vec2(pCurrent->m_FromX, pCurrent->m_FromY);
	const vec2 Dir = normalize(Pos-From);

	static int s_LastGameTick = Client()->GameTick();
	static float s_LastIntraTick = Client()->IntraGameTick();
	if(!m_pClient->IsWorldPaused())
	{
		s_LastGameTick = Client()->GameTick();
		s_LastIntraTick = Client()->IntraGameTick();
	}

	// This is not using s_LastGameTick because m_StartTick is synchronized by the server
	const float LifetimeMillis = 1000.0f * (Client()->GameTick() - pCurrent->m_StartTick + s_LastIntraTick) / Client()->GameTickSpeed();
	const float RemainingRelativeLifetime = 1.0f - clamp(LifetimeMillis / m_pClient->m_Tuning.m_LaserBounceDelay, 0.0f, 1.0f);

	Graphics()->BlendNormal();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// do outline
	const vec4 OuterColor(0.075f, 0.075f, 0.25f, 1.0f);
	const vec2 Outer = vec2(Dir.y, -Dir.x) * (7.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(OuterColor);
	IGraphics::CFreeformItem Freeform(
			From.x-Outer.x, From.y-Outer.y,
			From.x+Outer.x, From.y+Outer.y,
			Pos.x-Outer.x, Pos.y-Outer.y,
			Pos.x+Outer.x, Pos.y+Outer.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	// do inner
	const vec4 InnerColor(0.5f, 0.5f, 1.0f, 1.0f);
	const vec2 Inner = vec2(Dir.y, -Dir.x) * (5.0f*RemainingRelativeLifetime);
	Graphics()->SetColor(InnerColor);
	Freeform = IGraphics::CFreeformItem(
			From.x-Inner.x, From.y-Inner.y,
			From.x+Inner.x, From.y+Inner.y,
			Pos.x-Inner.x, Pos.y-Inner.y,
			Pos.x+Inner.x, Pos.y+Inner.y);
	Graphics()->QuadsDrawFreeform(&Freeform, 1);

	Graphics()->QuadsEnd();

	// render head
	Graphics()->BlendNormal();
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_PARTICLES].m_Id);
	Graphics()->QuadsBegin();

	const int aSprites[] = { SPRITE_PART_SPLAT01, SPRITE_PART_SPLAT02, SPRITE_PART_SPLAT03 };
	RenderTools()->SelectSprite(aSprites[s_LastGameTick%3]);
	Graphics()->QuadsSetRotation(s_LastGameTick);
	Graphics()->SetColor(OuterColor);
	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 24, 24);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->SetColor(InnerColor);
	QuadItem = IGraphics::CQuadItem(Pos.x, Pos.y, 20, 20);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsEnd();

	Graphics()->BlendNormal();
}